

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O2

void get_random_esis(int nESIs,uint32_t *ESIs)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  undefined8 uStack_40;
  uint32_t *local_38;
  
  uVar3 = nESIs * 3;
  lVar2 = -((ulong)uVar3 * 4 + 0xf & 0xfffffffffffffff0);
  lVar4 = lVar2 + -0x38;
  uVar6 = 0;
  uVar7 = 0;
  local_38 = ESIs;
  if (0 < (int)uVar3) {
    uVar7 = (ulong)uVar3;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)&local_38 + uVar6 * 4 + lVar4 + 0x38) = 0xffffffff;
  }
  if (nESIs < 1) {
    nESIs = 0;
  }
  uVar6 = 0;
LAB_0010173b:
  if (uVar6 == (uint)nESIs) {
    return;
  }
  do {
    *(undefined8 *)((long)&uStack_40 + lVar2) = 0x101745;
    uVar5 = rand();
    uVar5 = uVar5 & 0xffffff;
    uVar7 = (ulong)uVar5 % (ulong)uVar3;
    while( true ) {
      iVar8 = (int)uVar7;
      uVar1 = *(uint *)((long)&local_38 + (long)iVar8 * 4 + lVar4 + 0x38);
      if (uVar1 == 0xffffffff) {
        *(uint *)((long)&local_38 + (long)iVar8 * 4 + lVar4 + 0x38) = uVar5;
        local_38[uVar6] = uVar5;
        uVar6 = uVar6 + 1;
        goto LAB_0010173b;
      }
      if (uVar1 == uVar5) break;
      uVar7 = (ulong)(iVar8 + 1U);
      if (iVar8 + 1U == uVar3) {
        uVar7 = 0;
      }
    }
  } while( true );
}

Assistant:

void get_random_esis(int nESIs, uint32_t* ESIs)
{
	/* We use a linear probing hashing table
	 * to detect collisions.
	 */
	int hashtab_sz = 3*nESIs;
	uint32_t hESIs[hashtab_sz];
	const uint32_t hempty = (uint32_t)-1;
	for (int i = 0; i < hashtab_sz; ++i)
		hESIs[i] = hempty;
	for (int j = 0; j < nESIs; ++j) {
		uint32_t proposed_value;
		bool retry;
		int hidx;
		do {
			proposed_value = rand() & 0xffffff;
			hidx = (int)(proposed_value % hashtab_sz);
			retry = false;
			while (hESIs[hidx] != hempty) {
				if (hESIs[hidx] == proposed_value) {
					retry = true;
					break;
				}
				if (++hidx == hashtab_sz) {
					hidx = 0;
				}
			}
		} while(retry);
		assert(hESIs[hidx] == hempty);
		hESIs[hidx] = proposed_value;
		ESIs[j] = proposed_value;
	}
}